

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O3

unsigned_long crc32(crc32_t *crc,uchar *data,unsigned_long len)

{
  ulong uVar1;
  unsigned_long uVar2;
  
  uVar1 = crc->init;
  if (len != 0) {
    uVar2 = 0;
    do {
      uVar1 = uVar1 << 8 ^ crc->table[(ulong)data[uVar2] ^ uVar1 >> 0x18];
      uVar2 = uVar2 + 1;
    } while (len != uVar2);
  }
  return (ulong)((uint)uVar1 ^ (uint)crc->xor);
}

Assistant:

unsigned long crc32(crc32_t *crc,
                    unsigned char *data, unsigned long len) {
  unsigned long r = crc->init;
  unsigned char *ptr = data;
  while (len--)
    r = (r << 8) ^ crc->table[(r >> 24) ^ *ptr++];

  r ^= crc->xor;
  r &= 0xFFFFFFFF;
  return r;
}